

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rnn.cc
# Opt level: O2

Expression __thiscall
cnn::SimpleRNNBuilder::add_input_impl(SimpleRNNBuilder *this,int prev,Expression *in)

{
  long lVar1;
  undefined8 *puVar2;
  long lVar3;
  undefined8 *in_RCX;
  long lVar4;
  undefined4 in_register_00000034;
  long lVar5;
  long lVar6;
  uint i;
  ulong uVar7;
  long lVar8;
  double extraout_XMM0_Qa;
  double extraout_XMM0_Qa_00;
  double dVar9;
  Expression EVar10;
  Expression y;
  initializer_list<cnn::expr::Expression> local_a0;
  vector<std::vector<cnn::expr::Expression,std::allocator<cnn::expr::Expression>>,std::allocator<std::vector<cnn::expr::Expression,std::allocator<cnn::expr::Expression>>>>
  *local_90;
  int local_84;
  undefined1 local_80 [56];
  undefined8 local_48;
  SimpleRNNBuilder *local_40;
  long local_38;
  
  lVar5 = CONCAT44(in_register_00000034,prev);
  lVar6 = *(long *)(lVar5 + 0x58);
  lVar8 = *(long *)(lVar5 + 0x60);
  local_40 = this;
  std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>::vector
            ((vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_> *)local_80,
             (ulong)*(uint *)(lVar5 + 0x88),(allocator_type *)&y);
  local_90 = (vector<std::vector<cnn::expr::Expression,std::allocator<cnn::expr::Expression>>,std::allocator<std::vector<cnn::expr::Expression,std::allocator<cnn::expr::Expression>>>>
              *)(lVar5 + 0x58);
  std::
  vector<std::vector<cnn::expr::Expression,std::allocator<cnn::expr::Expression>>,std::allocator<std::vector<cnn::expr::Expression,std::allocator<cnn::expr::Expression>>>>
  ::emplace_back<std::vector<cnn::expr::Expression,std::allocator<cnn::expr::Expression>>>
            ((vector<std::vector<cnn::expr::Expression,std::allocator<cnn::expr::Expression>>,std::allocator<std::vector<cnn::expr::Expression,std::allocator<cnn::expr::Expression>>>>
              *)(lVar5 + 0x58),
             (vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_> *)local_80);
  std::_Vector_base<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>::~_Vector_base
            ((_Vector_base<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_> *)local_80
            );
  local_80._0_8_ = *in_RCX;
  local_80._8_4_ = *(undefined4 *)(in_RCX + 1);
  local_84 = (int)in;
  lVar4 = 8;
  lVar6 = ((lVar8 - lVar6) / 0x18 & 0xffffffffU) * 0x18;
  local_38 = ((ulong)in & 0xffffffff) * 0x18;
  lVar8 = 0;
  uVar7 = 0;
  do {
    if (*(uint *)(lVar5 + 0x88) <= uVar7) {
      lVar6 = *(long *)(*(long *)local_90 + 8 + lVar6);
      (local_40->super_RNNBuilder)._vptr_RNNBuilder = *(_func_int ***)(lVar6 + -0x10);
      (local_40->super_RNNBuilder).cur.t = *(int *)(lVar6 + -8);
      EVar10._8_8_ = lVar6;
      EVar10.pg = (ComputationGraph *)local_40;
      return EVar10;
    }
    lVar1 = *(long *)(lVar5 + 0x40);
    puVar2 = *(undefined8 **)(lVar1 + lVar8);
    local_80._16_8_ = *puVar2;
    local_80._24_4_ = *(undefined4 *)(puVar2 + 1);
    local_a0._M_len = 3;
    local_a0._M_array = (iterator)local_80;
    local_80._32_8_ = local_80._0_8_;
    local_80._0_8_ = (ComputationGraph *)puVar2[4];
    local_80._40_4_ = local_80._8_4_;
    local_80._8_4_ = *(uint *)(puVar2 + 5);
    expr::detail::f<cnn::AffineTransform,std::initializer_list<cnn::expr::Expression>>
              ((detail *)&y,&local_a0);
    dVar9 = extraout_XMM0_Qa;
    if (local_84 == -1) {
      lVar3 = *(long *)(lVar5 + 0x70);
      if (*(long *)(lVar5 + 0x78) != lVar3) {
        local_80._16_8_ = *(undefined8 *)(*(long *)(lVar1 + lVar8) + 0x10);
        local_80._24_4_ = *(undefined4 *)(*(long *)(lVar1 + lVar8) + 0x18);
        goto LAB_00238324;
      }
    }
    else if (-1 < local_84) {
      local_80._16_8_ = *(undefined8 *)(*(long *)(lVar1 + lVar8) + 0x10);
      local_80._24_4_ = *(undefined4 *)(*(long *)(lVar1 + lVar8) + 0x18);
      lVar3 = *(long *)(*(long *)local_90 + local_38);
LAB_00238324:
      local_80._8_4_ = y.i.t;
      local_80._0_8_ = y.pg;
      local_80._32_8_ = *(undefined8 *)(lVar3 + -8 + lVar4);
      local_80._40_4_ = *(uint *)(lVar3 + lVar4);
      local_48 = 3;
      local_80._48_8_ = (ComputationGraph *)local_80;
      expr::detail::f<cnn::AffineTransform,std::initializer_list<cnn::expr::Expression>>
                ((detail *)&local_a0,(initializer_list<cnn::expr::Expression> *)(local_80 + 0x30));
      y.pg = (ComputationGraph *)local_a0._M_array;
      y.i.t = (uint)local_a0._M_len;
      dVar9 = extraout_XMM0_Qa_00;
    }
    expr::tanh((expr *)local_80,dVar9);
    uVar7 = uVar7 + 1;
    lVar8 = lVar8 + 0x18;
    lVar1 = *(long *)(*(long *)local_90 + lVar6);
    *(undefined8 *)(lVar1 + -8 + lVar4) = local_80._0_8_;
    *(undefined4 *)(lVar1 + lVar4) = local_80._8_4_;
    lVar4 = lVar4 + 0x10;
  } while( true );
}

Assistant:

Expression SimpleRNNBuilder::add_input_impl(int prev, const Expression &in) {
  const unsigned t = h.size();
  h.push_back(vector<Expression>(layers));

  Expression x = in;

  for (unsigned i = 0; i < layers; ++i) {
    const vector<Expression>& vars = param_vars[i];

    // y <--- f(x)
    Expression y = affine_transform({vars[2], vars[0], x});

    // y <--- g(y_prev)
    if (prev == -1 && h0.size() > 0)
      y = affine_transform({y, vars[1], h0[i]});
    else if (prev >= 0)
      y = affine_transform({y, vars[1], h[prev][i]});

    // x <--- tanh(y)
    x = h[t][i] = tanh(y);
  }
  return h[t].back();
}